

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH35
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_108;
  ulong local_100;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  size_t *local_c8;
  int local_bc;
  ulong local_b8 [4];
  ContextLut local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_88 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  local_80 = (position - 7) + num_bytes;
  local_48 = position;
  if (7 < num_bytes) {
    local_48 = local_80;
  }
  local_50 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_50 = 0x40;
  }
  local_90 = position + num_bytes;
  local_58 = (position - 1) + num_bytes;
  local_98 = literal_context_lut;
  local_60 = *(long *)(literal_context_lut + 0x10);
  local_e0 = *(ulong *)dist_cache;
  uVar14 = local_50 + position;
  uVar12 = (uint)ringbuffer_mask;
  local_78 = ringbuffer_mask & 0xffffffff;
  local_68 = (ulong)(uint)((int)local_50 * 4);
  local_c8 = last_insert_len;
  uVar17 = local_68;
  do {
    local_108 = local_90;
LAB_0011a672:
    uVar20 = position;
    if (local_108 <= uVar20 + 8) {
      *(ulong *)dist_cache = (local_e0 + local_108) - uVar20;
      *(long *)commands = *(long *)commands + ((long)local_c8 - (long)last_insert_len >> 4);
      return;
    }
    local_108 = local_108 - uVar20;
    uVar15 = local_88;
    if (uVar20 < local_88) {
      uVar15 = uVar20;
    }
    uVar9 = uVar20 & ringbuffer_mask;
    uVar16 = ringbuffer[uVar9];
    local_f0 = (ulong)*(int *)&(hasher->common).extra;
    if ((uVar20 - local_f0 < uVar20) &&
       (uVar19 = (ulong)((uint)(uVar20 - local_f0) & uVar12), uVar16 == ringbuffer[uVar19])) {
      uVar6 = local_108 & 0xfffffffffffffff8;
      uVar22 = 0;
      lVar7 = 0;
LAB_0011a6f0:
      if (local_108 >> 3 == uVar22) {
        uVar22 = (ulong)((uint)local_108 & 7);
        for (; (bVar25 = uVar22 != 0, uVar22 = uVar22 - 1, local_e8 = local_108, bVar25 &&
               (local_e8 = uVar6, ringbuffer[uVar6 + uVar19] == ringbuffer[uVar6 + uVar9]));
            uVar6 = uVar6 + 1) {
        }
      }
      else {
        if (*(ulong *)(ringbuffer + uVar22 * 8 + uVar9) ==
            *(ulong *)(ringbuffer + uVar22 * 8 + uVar19)) break;
        uVar6 = *(ulong *)(ringbuffer + uVar22 * 8 + uVar19) ^
                *(ulong *)(ringbuffer + uVar22 * 8 + uVar9);
        uVar19 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        local_e8 = (uVar19 >> 3 & 0x1fffffff) - lVar7;
      }
      if ((local_e8 < 4) || (local_120 = local_e8 * 0x87 + 0x78f, local_120 < 0x7e5))
      goto LAB_0011a71d;
      uVar16 = ringbuffer[local_e8 + uVar9];
    }
    else {
LAB_0011a71d:
      local_120 = 0x7e4;
      local_f0 = 0;
      local_e8 = 0;
    }
    lVar7 = *(long *)&(params->hasher).num_last_distances_to_check;
    local_b8[0] = (ulong)(*(long *)(ringbuffer + uVar9) * -0x42e1ca5843000000) >> 0x30;
    local_b8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar9) * -0x42e1ca5843000000) >>
                                  0x30) + 8 & 0xffff);
    uVar4 = (uint)uVar20;
    uVar19 = (ulong)((uint)local_108 & 7);
    for (lVar24 = 0; lVar24 != 2; lVar24 = lVar24 + 1) {
      uVar5 = *(uint *)(lVar7 + local_b8[lVar24] * 4);
      uVar3 = uVar12 & uVar5;
      if (((uVar16 == ringbuffer[local_e8 + uVar3]) && (uVar20 != uVar5)) &&
         (uVar6 = uVar20 - uVar5, uVar6 <= uVar15)) {
        uVar22 = 0;
        lVar23 = 0;
LAB_0011a7cf:
        uVar10 = local_108 & 0xfffffffffffffff8;
        uVar11 = uVar19;
        if (local_108 >> 3 == uVar22) {
          for (; (uVar22 = local_108, uVar11 != 0 &&
                 (uVar22 = uVar10, ringbuffer[uVar10 + uVar3] == ringbuffer[uVar10 + uVar9]));
              uVar10 = uVar10 + 1) {
            uVar11 = uVar11 - 1;
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar22 * 8 + uVar9) ==
              *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar3)) goto code_r0x0011a7e1;
          uVar10 = *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar3) ^
                   *(ulong *)(ringbuffer + uVar22 * 8 + uVar9);
          uVar22 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar22 = (uVar22 >> 3 & 0x1fffffff) - lVar23;
        }
        if (3 < uVar22) {
          iVar13 = 0x1f;
          if ((uint)uVar6 != 0) {
            for (; (uint)uVar6 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
          uVar10 = (ulong)(iVar13 * -0x1e + 0x780) + uVar22 * 0x87;
          if (local_120 < uVar10) {
            uVar16 = ringbuffer[uVar22 + uVar9];
            local_e8 = uVar22;
            local_120 = uVar10;
            local_f0 = uVar6;
          }
        }
      }
    }
    *(uint *)(lVar7 + *(long *)((long)local_b8 + (ulong)(uVar4 & 8)) * 4) = uVar4;
    if (0x1f < local_108 && (uVar20 & 3) == 0) {
      for (sVar21 = (params->dist).max_distance; sVar21 <= uVar20; sVar21 = sVar21 + 4) {
        uVar5 = (params->dist).distance_postfix_bits;
        uVar3 = uVar5 & 0x3fffffff;
        (params->dist).distance_postfix_bits =
             uVar5 * *(int *)((long)&(params->dictionary).words + 4) +
             (uint)ringbuffer[sVar21 + 0x20 & ringbuffer_mask] +
             ~(uint)ringbuffer[sVar21 & ringbuffer_mask] * (params->dictionary).num_transforms + 1;
        if (uVar3 < 0x1000000) {
          lVar24 = *(long *)&(params->dist).alphabet_size_max;
          uVar5 = *(uint *)(lVar24 + (ulong)uVar3 * 4);
          *(int *)(lVar24 + (ulong)uVar3 * 4) = (int)sVar21;
          if ((sVar21 == uVar20) && (uVar5 != 0xffffffff)) {
            uVar3 = uVar4 - uVar5;
            if (uVar3 <= uVar15) {
              uVar6 = 0;
              lVar24 = 0;
LAB_0011a91d:
              uVar22 = local_108 & 0xfffffffffffffff8;
              uVar10 = uVar19;
              if (local_108 >> 3 == uVar6) {
                for (; (uVar6 = local_108, uVar10 != 0 &&
                       (uVar6 = uVar22,
                       ringbuffer[uVar22 + (uVar5 & uVar12)] == ringbuffer[uVar22 + uVar9]));
                    uVar22 = uVar22 + 1) {
                  uVar10 = uVar10 - 1;
                }
              }
              else {
                if (*(ulong *)(ringbuffer + uVar6 * 8 + uVar9) ==
                    *(ulong *)(ringbuffer + uVar6 * 8 + (ulong)(uVar5 & uVar12)))
                goto code_r0x0011a92f;
                uVar22 = *(ulong *)(ringbuffer + uVar6 * 8 + (ulong)(uVar5 & uVar12)) ^
                         *(ulong *)(ringbuffer + uVar6 * 8 + uVar9);
                uVar6 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                  }
                }
                uVar6 = (uVar6 >> 3 & 0x1fffffff) - lVar24;
              }
              if ((3 < uVar6) && (local_e8 < uVar6)) {
                iVar13 = 0x1f;
                if (uVar3 != 0) {
                  for (; uVar3 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                  }
                }
                uVar22 = (ulong)(iVar13 * -0x1e + 0x780) + uVar6 * 0x87;
                if (local_120 < uVar22) {
                  local_120 = uVar22;
                  local_f0 = (ulong)uVar3;
                  local_e8 = uVar6;
                }
              }
            }
          }
        }
      }
      (params->dist).max_distance = uVar20 + 4;
    }
    if (local_120 < 0x7e5) {
      local_e0 = local_e0 + 1;
      position = uVar20 + 1;
      local_108 = local_90;
      if ((num_literals == (size_t *)0x0) && (local_108 = local_90, uVar14 < position)) {
        if (uVar14 + uVar17 < position) {
          uVar15 = uVar20 + 0x11;
          if (local_80 <= uVar20 + 0x11) {
            uVar15 = local_80;
          }
          for (; position < uVar15; position = position + 4) {
            *(uint *)(lVar7 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                      (position & ringbuffer_mask))
                                                            * -0x42e1ca5843000000) >> 0x30) +
                                      ((uint)position & 8) & 0xffff) * 4) = (uint)position;
            local_e0 = local_e0 + 4;
          }
        }
        else {
          uVar15 = uVar20 + 9;
          if (local_80 <= uVar20 + 9) {
            uVar15 = local_80;
          }
          for (; position < uVar15; position = position + 2) {
            *(uint *)(lVar7 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                      (position & ringbuffer_mask))
                                                            * -0x42e1ca5843000000) >> 0x30) +
                                      ((uint)position & 8) & 0xffff) * 4) = (uint)position;
            local_e0 = local_e0 + 2;
          }
        }
      }
      goto LAB_0011a672;
    }
    local_70 = local_e0 + 4;
    uVar14 = local_58 - uVar20;
    local_bc = 0;
    do {
      local_b8[3] = (ulong)((uint)uVar14 & 7);
      uVar15 = uVar14 >> 3;
      local_108 = local_108 - 1;
      uVar17 = local_e8 - 1;
      if (local_108 <= local_e8 - 1) {
        uVar17 = local_108;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar17 = 0;
      }
      uVar9 = uVar20 + 1;
      uVar19 = local_88;
      if (uVar9 < local_88) {
        uVar19 = uVar9;
      }
      uVar6 = uVar9 & ringbuffer_mask;
      uVar16 = ringbuffer[uVar17 + uVar6];
      local_128 = (ulong)*(int *)&(hasher->common).extra;
      local_100 = 0x7e4;
      if ((uVar9 - local_128 < uVar9) &&
         (uVar4 = (uint)(uVar9 - local_128) & uVar12, uVar16 == ringbuffer[uVar17 + uVar4])) {
        uVar22 = 0;
        lVar24 = 0;
LAB_0011abc6:
        if (uVar15 == uVar22) {
          uVar22 = local_b8[3];
          for (local_118 = -lVar24;
              (bVar25 = uVar22 != 0, uVar22 = uVar22 - 1, bVar25 &&
              (ringbuffer[local_118 + uVar4] == ringbuffer[local_118 + uVar6]));
              local_118 = local_118 + 1) {
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar22 * 8 + uVar6) ==
              *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar4)) goto code_r0x0011abe3;
          uVar10 = *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar4) ^
                   *(ulong *)(ringbuffer + uVar22 * 8 + uVar6);
          uVar22 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          local_118 = (uVar22 >> 3 & 0x1fffffff) - lVar24;
        }
        if ((local_118 < 4) || (uVar22 = local_118 * 0x87 + 0x78f, uVar22 < 0x7e5))
        goto LAB_0011ac3c;
        uVar16 = ringbuffer[local_118 + uVar6];
        uVar17 = local_118;
        local_100 = uVar22;
      }
      else {
LAB_0011ac3c:
        local_128 = 0;
        local_118 = 0;
      }
      local_b8[0] = (ulong)(*(long *)(ringbuffer + uVar6) * -0x42e1ca5843000000) >> 0x30;
      local_b8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar6) * -0x42e1ca5843000000) >>
                                    0x30) + 8 & 0xffff);
      uVar4 = (uint)uVar9;
      local_38 = *(long *)((long)local_b8 + (ulong)(uVar4 & 8));
      for (lVar24 = 0; lVar24 != 2; lVar24 = lVar24 + 1) {
        uVar5 = *(uint *)(lVar7 + local_b8[lVar24] * 4);
        uVar3 = uVar12 & uVar5;
        if (((uVar16 == ringbuffer[uVar17 + uVar3]) && (uVar9 != uVar5)) &&
           (uVar22 = uVar9 - uVar5, uVar22 <= uVar19)) {
          uVar10 = 0;
          lVar23 = 0;
LAB_0011acd1:
          if (uVar15 == uVar10) {
            local_40 = local_b8[3];
            for (uVar10 = -lVar23;
                (bVar25 = local_40 != 0, local_40 = local_40 - 1, bVar25 &&
                (ringbuffer[uVar10 + uVar3] == ringbuffer[uVar10 + uVar6])); uVar10 = uVar10 + 1) {
            }
          }
          else {
            if (*(ulong *)(ringbuffer + uVar10 * 8 + uVar6) ==
                *(ulong *)(ringbuffer + uVar10 * 8 + (ulong)uVar3)) goto code_r0x0011acea;
            uVar11 = *(ulong *)(ringbuffer + uVar10 * 8 + (ulong)uVar3) ^
                     *(ulong *)(ringbuffer + uVar10 * 8 + uVar6);
            uVar10 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            uVar10 = (uVar10 >> 3 & 0x1fffffff) - lVar23;
          }
          if (3 < uVar10) {
            iVar13 = 0x1f;
            if ((uint)uVar22 != 0) {
              for (; (uint)uVar22 >> iVar13 == 0; iVar13 = iVar13 + -1) {
              }
            }
            uVar11 = (ulong)(iVar13 * -0x1e + 0x780) + uVar10 * 0x87;
            if (local_100 < uVar11) {
              uVar16 = ringbuffer[uVar10 + uVar6];
              uVar17 = uVar10;
              local_128 = uVar22;
              local_118 = uVar10;
              local_100 = uVar11;
            }
          }
        }
      }
      *(uint *)(lVar7 + local_38 * 4) = uVar4;
      if (0x1f < local_108 && (uVar9 & 3) == 0) {
        for (sVar21 = (params->dist).max_distance; sVar21 <= uVar9; sVar21 = sVar21 + 4) {
          uVar5 = (params->dist).distance_postfix_bits;
          uVar3 = uVar5 & 0x3fffffff;
          (params->dist).distance_postfix_bits =
               uVar5 * *(int *)((long)&(params->dictionary).words + 4) +
               (uint)ringbuffer[sVar21 + 0x20 & ringbuffer_mask] +
               ~(uint)ringbuffer[sVar21 & ringbuffer_mask] * (params->dictionary).num_transforms + 1
          ;
          if (uVar3 < 0x1000000) {
            lVar24 = *(long *)&(params->dist).alphabet_size_max;
            uVar5 = *(uint *)(lVar24 + (ulong)uVar3 * 4);
            *(int *)(lVar24 + (ulong)uVar3 * 4) = (int)sVar21;
            if ((sVar21 == uVar9) && (uVar5 != 0xffffffff)) {
              uVar3 = uVar4 - uVar5;
              if (uVar3 <= uVar19) {
                uVar17 = 0;
                lVar24 = 0;
LAB_0011ae44:
                if (uVar15 == uVar17) {
                  uVar22 = local_b8[3];
                  for (uVar17 = -lVar24;
                      (bVar25 = uVar22 != 0, uVar22 = uVar22 - 1, bVar25 &&
                      (ringbuffer[uVar17 + (uVar5 & uVar12)] == ringbuffer[uVar17 + uVar6]));
                      uVar17 = uVar17 + 1) {
                  }
                }
                else {
                  if (*(ulong *)(ringbuffer + uVar17 * 8 + uVar6) ==
                      *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)(uVar5 & uVar12)))
                  goto code_r0x0011ae5d;
                  uVar22 = *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)(uVar5 & uVar12)) ^
                           *(ulong *)(ringbuffer + uVar17 * 8 + uVar6);
                  uVar17 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar17 = (uVar17 >> 3 & 0x1fffffff) - lVar24;
                }
                if ((3 < uVar17) && (local_118 < uVar17)) {
                  iVar13 = 0x1f;
                  if (uVar3 != 0) {
                    for (; uVar3 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                    }
                  }
                  uVar22 = (ulong)(iVar13 * -0x1e + 0x780) + uVar17 * 0x87;
                  if (local_100 < uVar22) {
                    local_128 = (ulong)uVar3;
                    local_118 = uVar17;
                    local_100 = uVar22;
                  }
                }
              }
            }
          }
        }
        (params->dist).max_distance = uVar20 + 5;
      }
      uVar17 = uVar20;
      uVar15 = local_e0;
      if ((local_100 < local_120 + 0xaf) ||
         (local_f0 = local_128, local_e8 = local_118, uVar17 = uVar9, uVar15 = local_70,
         local_bc == 3)) break;
      local_e0 = local_e0 + 1;
      local_bc = local_bc + 1;
      uVar19 = uVar20 + 9;
      uVar14 = uVar14 - 1;
      local_120 = local_100;
      uVar20 = uVar9;
      uVar15 = local_e0;
    } while (uVar19 < local_90);
    local_e0 = uVar15;
    uVar14 = local_60 + uVar17;
    if (local_88 <= uVar14) {
      uVar14 = local_88;
    }
    if (uVar14 < local_f0) {
LAB_0011afb6:
      uVar15 = local_f0 + 0xf;
LAB_0011afba:
      if ((local_f0 <= uVar14) && (uVar15 != 0)) {
        *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
             (int)(hasher->common).dict_num_lookups;
        *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
        *(int *)&(hasher->common).extra = (int)local_f0;
      }
    }
    else {
      uVar20 = (ulong)*(int *)&(hasher->common).extra;
      if (local_f0 != uVar20) {
        uVar9 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
        uVar15 = 1;
        if (local_f0 != uVar9) {
          uVar20 = (local_f0 + 3) - uVar20;
          if (uVar20 < 7) {
            bVar8 = (byte)((int)uVar20 << 2);
            uVar4 = 0x9750468;
          }
          else {
            uVar9 = (local_f0 + 3) - uVar9;
            if (6 < uVar9) {
              uVar15 = 2;
              if ((local_f0 != (long)(int)(hasher->common).dict_num_lookups) &&
                 (uVar15 = 3,
                 local_f0 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
              goto LAB_0011afb6;
              goto LAB_0011afba;
            }
            bVar8 = (byte)((int)uVar9 << 2);
            uVar4 = 0xfdb1ace;
          }
          uVar15 = (ulong)(uVar4 >> (bVar8 & 0x1f) & 0xf);
        }
        goto LAB_0011afba;
      }
      uVar15 = 0;
    }
    uVar4 = (uint)local_e0;
    *(uint *)local_c8 = uVar4;
    uVar3 = (uint)local_e8;
    *(uint *)((long)local_c8 + 4) = uVar3;
    uVar14 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
    uVar5 = 0;
    if (uVar14 <= uVar15) {
      bVar8 = (byte)*(uint *)(literal_context_lut + 0x40);
      uVar20 = ((4L << (bVar8 & 0x3f)) + (uVar15 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
      uVar5 = 0x1f;
      uVar18 = (uint)uVar20;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = (uVar5 ^ 0xffffffe0) + 0x1f;
      uVar9 = (ulong)((uVar20 >> ((ulong)uVar5 & 0x3f) & 1) != 0);
      lVar24 = (ulong)uVar5 - (ulong)*(uint *)(literal_context_lut + 0x40);
      uVar15 = (~(-1 << (bVar8 & 0x1f)) & uVar18) + uVar14 +
               (uVar9 + lVar24 * 2 + 0xfffe << (bVar8 & 0x3f)) | lVar24 * 0x400;
      uVar5 = (uint)(uVar20 - (uVar9 + 2 << ((byte)uVar5 & 0x3f)) >> (bVar8 & 0x3f));
    }
    *(short *)((long)local_c8 + 0xe) = (short)uVar15;
    *(uint *)(local_c8 + 1) = uVar5;
    if (5 < local_e0) {
      if (local_e0 < 0x82) {
        uVar4 = 0x1f;
        uVar5 = (uint)(local_e0 - 2);
        if (uVar5 != 0) {
          for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = (int)(local_e0 - 2 >> ((char)(uVar4 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                (uVar4 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (local_e0 < 0x842) {
        uVar5 = 0x1f;
        if (uVar4 - 0x42 != 0) {
          for (; uVar4 - 0x42 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar4 = (uVar5 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar4 = 0x15;
        if (0x1841 < local_e0) {
          uVar4 = (uint)(ushort)(0x17 - (local_e0 < 0x5842));
        }
      }
    }
    uVar14 = (ulong)(int)uVar3;
    if (uVar14 < 10) {
      uVar5 = uVar3 - 2;
    }
    else if (uVar14 < 0x86) {
      uVar5 = 0x1f;
      uVar3 = (uint)(uVar14 - 6);
      if (uVar3 != 0) {
        for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = (int)(uVar14 - 6 >> ((char)(uVar5 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar5 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar5 = 0x17;
      if (uVar14 < 0x846) {
        uVar5 = 0x1f;
        if (uVar3 - 0x46 != 0) {
          for (; uVar3 - 0x46 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = (uVar5 ^ 0xffe0) + 0x2c;
      }
    }
    uVar1 = (ushort)uVar5;
    sVar2 = (uVar1 & 7) + ((ushort)uVar4 & 7) * 8;
    if ((((uVar15 & 0x3ff) == 0) && ((ushort)uVar4 < 8)) && (uVar1 < 0x10)) {
      if (7 < uVar1) {
        sVar2 = sVar2 + 0x40;
      }
    }
    else {
      iVar13 = ((uVar4 & 0xffff) >> 3) * 3 + ((uVar5 & 0xffff) >> 3);
      sVar2 = sVar2 + ((ushort)(0x520d40 >> ((char)iVar13 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar13 * 0x40 + 0x40;
    }
    *(short *)((long)local_c8 + 0xc) = sVar2;
    *num_commands = *num_commands + local_e0;
    position = local_e8 + uVar17;
    uVar20 = local_48;
    if (position < local_48) {
      uVar20 = position;
    }
    uVar15 = uVar17 + 2;
    if (local_f0 < local_e8 >> 2) {
      uVar14 = position + local_f0 * -4;
      if (uVar14 < uVar15) {
        uVar14 = uVar15;
      }
      uVar15 = uVar14;
      if (uVar20 < uVar14) {
        uVar15 = uVar20;
      }
    }
    uVar14 = uVar17 + local_50 + local_e8 * 2;
    local_c8 = local_c8 + 2;
    for (; uVar15 < uVar20; uVar15 = uVar15 + 1) {
      *(uint *)(lVar7 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                (uVar15 & ringbuffer_mask)) *
                                                      -0x42e1ca5843000000) >> 0x30) +
                                ((uint)uVar15 & 8) & 0xffff) * 4) = (uint)uVar15;
    }
    local_e0 = 0;
    uVar17 = local_68;
  } while( true );
  lVar7 = lVar7 + -8;
  uVar22 = uVar22 + 1;
  goto LAB_0011a6f0;
code_r0x0011a7e1:
  lVar23 = lVar23 + -8;
  uVar22 = uVar22 + 1;
  goto LAB_0011a7cf;
code_r0x0011a92f:
  lVar24 = lVar24 + -8;
  uVar6 = uVar6 + 1;
  goto LAB_0011a91d;
code_r0x0011abe3:
  lVar24 = lVar24 + -8;
  uVar22 = uVar22 + 1;
  goto LAB_0011abc6;
code_r0x0011acea:
  lVar23 = lVar23 + -8;
  uVar10 = uVar10 + 1;
  goto LAB_0011acd1;
code_r0x0011ae5d:
  lVar24 = lVar24 + -8;
  uVar17 = uVar17 + 1;
  goto LAB_0011ae44;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}